

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_relocation.hpp
# Opt level: O0

void __thiscall
ELFIO::relocation_section_accessor_template<ELFIO::section>::add_entry
          (relocation_section_accessor_template<ELFIO::section> *this,Elf64_Addr offset,
          Elf_Word symbol,uint type)

{
  uchar uVar1;
  Elf_Xword local_28;
  Elf_Xword info;
  uint type_local;
  Elf_Word symbol_local;
  Elf64_Addr offset_local;
  relocation_section_accessor_template<ELFIO::section> *this_local;
  
  uVar1 = elfio::get_class(this->elf_file);
  if (uVar1 == '\x01') {
    local_28 = (ulong)symbol * 0x100 + (ulong)(type & 0xff);
  }
  else {
    local_28 = CONCAT44(symbol,type);
  }
  add_entry(this,offset,local_28);
  return;
}

Assistant:

void add_entry( Elf64_Addr offset, Elf_Word symbol, unsigned type )
    {
        Elf_Xword info;
        if ( elf_file.get_class() == ELFCLASS32 ) {
            info = ELF32_R_INFO( (Elf_Xword)symbol, type );
        }
        else {
            info = ELF64_R_INFO( (Elf_Xword)symbol, type );
        }

        add_entry( offset, info );
    }